

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::GetModesForExplicitContextCreate
          (EventLog *this,bool *inRecord,bool *activelyRecording,bool *inReplay)

{
  TTDMode TVar1;
  
  TVar1 = this->m_currentMode;
  *inRecord = (TVar1 & (AnyExcludedMode|RecordMode)) == RecordMode;
  *activelyRecording =
       (TVar1 & (AnyExcludedMode|RecordMode|CurrentlyEnabled)) == (RecordMode|CurrentlyEnabled);
  *inReplay = (TVar1 & (AnyExcludedMode|ReplayMode)) == ReplayMode;
  return;
}

Assistant:

void EventLog::GetModesForExplicitContextCreate(bool& inRecord, bool& activelyRecording, bool& inReplay)
    {
        inRecord = (this->m_currentMode & (TTDMode::RecordMode | TTDMode::AnyExcludedMode)) == TTDMode::RecordMode;
        activelyRecording = (this->m_currentMode & (TTDMode::RecordMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordMode | TTDMode::CurrentlyEnabled);
        inReplay = (this->m_currentMode & (TTDMode::ReplayMode | TTDMode::AnyExcludedMode)) == TTDMode::ReplayMode;
    }